

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void merge(void *data,int esize,int i,int j,int k,arg_comparefn *comparefn)

{
  int iVar1;
  void *__src;
  int local_44;
  int local_40;
  int mpos;
  int jpos;
  int ipos;
  char *m;
  char *a;
  arg_comparefn *comparefn_local;
  int k_local;
  int j_local;
  int i_local;
  int esize_local;
  void *data_local;
  
  local_40 = j + 1;
  local_44 = 0;
  __src = argtable3_xmalloc((long)(esize * ((k - i) + 1)));
  mpos = i;
  while (mpos <= j || local_40 <= k) {
    if (j < mpos) {
      for (; local_40 <= k; local_40 = local_40 + 1) {
        memcpy((void *)((long)__src + (long)(local_44 * esize)),
               (void *)((long)data + (long)(local_40 * esize)),(long)esize);
        local_44 = local_44 + 1;
      }
    }
    else if (k < local_40) {
      for (; mpos <= j; mpos = mpos + 1) {
        memcpy((void *)((long)__src + (long)(local_44 * esize)),
               (void *)((long)data + (long)(mpos * esize)),(long)esize);
        local_44 = local_44 + 1;
      }
    }
    else {
      iVar1 = (*comparefn)((void *)((long)data + (long)(mpos * esize)),
                           (void *)((long)data + (long)(local_40 * esize)));
      if (iVar1 < 0) {
        memcpy((void *)((long)__src + (long)(local_44 * esize)),
               (void *)((long)data + (long)(mpos * esize)),(long)esize);
        mpos = mpos + 1;
      }
      else {
        memcpy((void *)((long)__src + (long)(local_44 * esize)),
               (void *)((long)data + (long)(local_40 * esize)),(long)esize);
        local_40 = local_40 + 1;
      }
      local_44 = local_44 + 1;
    }
  }
  memcpy((void *)((long)data + (long)(i * esize)),__src,(long)(esize * ((k - i) + 1)));
  argtable3_xfree(__src);
  return;
}

Assistant:

static void merge(void* data, int esize, int i, int j, int k, arg_comparefn* comparefn) {
    char* a = (char*)data;
    char* m;
    int ipos, jpos, mpos;

    /* Initialize the counters used in merging. */
    ipos = i;
    jpos = j + 1;
    mpos = 0;

    /* Allocate storage for the merged elements. */
    m = (char*)xmalloc((size_t)(esize * ((k - i) + 1)));

    /* Continue while either division has elements to merge. */
    while (ipos <= j || jpos <= k) {
        if (ipos > j) {
            /* The left division has no more elements to merge. */
            while (jpos <= k) {
                memcpy(&m[mpos * esize], &a[jpos * esize], (size_t)esize);
                jpos++;
                mpos++;
            }

            continue;
        } else if (jpos > k) {
            /* The right division has no more elements to merge. */
            while (ipos <= j) {
                memcpy(&m[mpos * esize], &a[ipos * esize], (size_t)esize);
                ipos++;
                mpos++;
            }

            continue;
        }

        /* Append the next ordered element to the merged elements. */
        if (comparefn(&a[ipos * esize], &a[jpos * esize]) < 0) {
            memcpy(&m[mpos * esize], &a[ipos * esize], (size_t)esize);
            ipos++;
            mpos++;
        } else {
            memcpy(&m[mpos * esize], &a[jpos * esize], (size_t)esize);
            jpos++;
            mpos++;
        }
    }

    /* Prepare to pass back the merged data. */
    memcpy(&a[i * esize], m, (size_t)(esize * ((k - i) + 1)));
    xfree(m);
}